

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::iterate(TessellationShaderTCTEgl_TessLevel *this)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  pointer p_Var7;
  TestError *pTVar8;
  long lVar9;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  _tessellation_shader_vertex_spacing vertex_spacing;
  float fVar11;
  char *local_280;
  MessageBuilder local_278;
  undefined1 local_f8 [8];
  string vertex_spacing_mode_string;
  float *point_data_ptr;
  uint n_point;
  uint n_result_points;
  float epsilon;
  float *mapped_data_ptr;
  uint n_bytes_needed;
  float outer_level1_clamped;
  float outer_level0_clamped;
  ApiType local_9c;
  float local_98;
  float local_94;
  GLfloat outer_tess_level [4];
  GLfloat inner_tess_level [2];
  uint n_combination;
  uint n_tessellation_level_combinations;
  GLfloat tessellation_level_combinations [18];
  __normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
  local_28;
  __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
  local_20;
  _tests_const_iterator test_iterator;
  Functions *gl;
  TessellationShaderTCTEgl_TessLevel *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  test_iterator._M_current = (_test_descriptor *)CONCAT44(extraout_var,iVar4);
  initTest(this);
  (**(code **)&test_iterator._M_current[0x70].vs_id)
            ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
  glu::checkError(dVar5,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdd4);
  (**(code **)&test_iterator._M_current[0x29].inner_tess_levels_uniform_location)(0x8c89);
  dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
  glu::checkError(dVar5,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdd8);
  local_28._M_current =
       (_test_descriptor *)
       std::
       vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
       ::begin(&this->m_tests);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const*,std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>>
  ::__normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor*>
            ((__normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const*,std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>>
              *)&local_20,&local_28);
  do {
    tessellation_level_combinations._64_8_ =
         std::
         vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
         ::end(&this->m_tests);
    bVar3 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
                        *)(tessellation_level_combinations + 0x10));
    if (!bVar3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    memcpy(&n_combination,&DAT_02b21030,0x48);
    for (inner_tess_level[0] = 0.0; (uint)inner_tess_level[0] < 3;
        inner_tess_level[0] = (GLfloat)((int)inner_tess_level[0] + 1)) {
      outer_tess_level[2] = (GLfloat)(&n_combination)[(uint)((int)inner_tess_level[0] * 6)];
      outer_tess_level[3] =
           tessellation_level_combinations[(ulong)(uint)((int)inner_tess_level[0] * 6) - 1];
      local_98 = (float)(&n_combination)[(int)inner_tess_level[0] * 6 + 2];
      local_94 = (float)(&n_combination)[(int)inner_tess_level[0] * 6 + 3];
      outer_tess_level[0] = (GLfloat)(&n_combination)[(int)inner_tess_level[0] * 6 + 4];
      outer_tess_level[1] = (GLfloat)(&n_combination)[(int)inner_tess_level[0] * 6 + 5];
      pcVar1 = *(code **)(test_iterator._M_current + 0xa0);
      p_Var7 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
               ::operator->(&local_20);
      (*pcVar1)(p_Var7->po_id);
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glUseProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xdf3);
      p_Var7 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
               ::operator->(&local_20);
      if (p_Var7->type == TESSELLATION_TEST_TYPE_FIRST) {
        pcVar1 = *(code **)&test_iterator._M_current[0x96].tcs_id;
        p_Var7 = __gnu_cxx::
                 __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
                 ::operator->(&local_20);
        (*pcVar1)(p_Var7->inner_tess_levels_uniform_location,1,outer_tess_level + 2);
        dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
        glu::checkError(dVar5,"glUniform2fv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xdfb);
        pcVar1 = *(code **)(test_iterator._M_current + 0x9a);
        p_Var7 = __gnu_cxx::
                 __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
                 ::operator->(&local_20);
        (*pcVar1)(p_Var7->outer_tess_levels_uniform_location,1,&local_98);
        dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
        glu::checkError(dVar5,"glUniform4fv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                        ,0xdff);
      }
      else {
        if (p_Var7->type != TESSELLATION_TEST_TYPE_TES) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Unrecognized test type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xe17);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
        local_9c.m_bits = (*pRVar6->_vptr_RenderContext[2])();
        bVar3 = glu::isContextTypeES((ContextType)local_9c.m_bits);
        if (!bVar3) {
          (**(code **)&test_iterator._M_current[0x70].tcs_id)(0x8e73,outer_tess_level + 2);
          dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
          glu::checkError(dVar5,
                          "glPatchParameterfv() call failed for GL_PATCH_DEFAULT_INNER_LEVEL pname",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                          ,0xe0b);
          (**(code **)&test_iterator._M_current[0x70].tcs_id)(0x8e74,&local_98);
          dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
          glu::checkError(dVar5,
                          "glPatchParameterfv() call failed for GL_PATCH_DEFAULT_OUTER_LEVEL pname",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                          ,0xe10);
        }
      }
      n_bytes_needed = 0;
      mapped_data_ptr._4_4_ = 0.0;
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,local_98,
                 this->m_gl_max_tess_gen_level_value,(float *)0x0,(float *)&n_bytes_needed);
      p_Var7 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
               ::operator->(&local_20);
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (p_Var7->vertex_spacing,local_94,this->m_gl_max_tess_gen_level_value,(float *)0x0,
                 (float *)((long)&mapped_data_ptr + 4));
      mapped_data_ptr._0_4_ =
           (int)(long)(float)n_bytes_needed * (int)(long)(mapped_data_ptr._4_4_ + 1.0) * 0x18;
      (**(code **)&test_iterator._M_current[9].po_id)(0x8c8e,(uint)mapped_data_ptr,0,0x88e4);
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glBufferData() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe37);
      (**(code **)&test_iterator._M_current[1].po_id)(0);
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glBeginTransformFeedback() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe3b);
      (**(code **)&test_iterator._M_current[0x25].vertex_spacing)(0xe,0,1);
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glDrawArrays() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe40);
      (**(code **)&test_iterator._M_current[0x2c].fs_id)();
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glEndTransformFeedback() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe43);
      lVar9 = (**(code **)&test_iterator._M_current[0x5c].tcs_id)(0x8c8e,0,(uint)mapped_data_ptr,1);
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe49);
      uVar2 = (uint)mapped_data_ptr >> 2;
      for (point_data_ptr._4_4_ = 0;
          point_data_ptr._4_4_ < SUB164((ZEXT816(0) << 0x40 | ZEXT416(uVar2)) / ZEXT816(6),0);
          point_data_ptr._4_4_ = point_data_ptr._4_4_ + 1) {
        vertex_spacing_mode_string.field_2._8_8_ = lVar9 + (ulong)(point_data_ptr._4_4_ * 6) * 4;
        fVar11 = de::abs<float>(*(float *)(vertex_spacing_mode_string.field_2._8_8_ + 8) - local_98)
        ;
        if ((1e-05 < fVar11) ||
           (fVar11 = de::abs<float>(*(float *)(vertex_spacing_mode_string.field_2._8_8_ + 0xc) -
                                    local_94), 1e-05 < fVar11)) {
          p_Var7 = __gnu_cxx::
                   __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
                   ::operator->(&local_20);
          TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                    ((string *)local_f8,(TessellationShaderUtils *)(ulong)p_Var7->vertex_spacing,
                     vertex_spacing);
          this_00 = tcu::TestContext::getLog
                              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_278,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (&local_278,
                               (char (*) [57])
                               "Invalid inner/outer tessellation level used in TE stage;");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [18])" expected outer:(");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_98);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_94);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b56371);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [18])" rendered outer:(");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(float *)(vertex_spacing_mode_string.field_2._8_8_ + 8));
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a4b1eb);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(float *)(vertex_spacing_mode_string.field_2._8_8_ + 0xc));
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2a94734);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [23])0x2b1bd4a);
          local_280 = (char *)std::__cxx11::string::c_str();
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_280);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_278);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Invalid inner/outer tessellation level used in TE stage",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                     ,0xe63);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      (**(code **)&test_iterator._M_current[0x9f].tes_id)(0x8c8e);
      dVar5 = (**(code **)&test_iterator._M_current[0x38].outer_tess_levels_uniform_location)();
      glu::checkError(dVar5,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xe69);
    }
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_TessLevel::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize ES test objects */
	initTest();

	/* Our program object takes a single vertex per patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Prepare for rendering */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

	/* We will iterate through all added tests. */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); ++test_iterator)
	{
		/* Iterate through a few different inner/outer tessellation level combinations */
		glw::GLfloat tessellation_level_combinations[] = {
			/* inner[0] */ /* inner[1] */ /* outer[0] */ /* outer[1] */ /* outer[2] */ /* outer[3] */
			1.1f, 1.4f, 2.7f, 3.1f, 4.4f, 5.7f, 64.2f, 32.5f, 16.8f, 8.2f, 4.5f, 2.8f, 3.3f, 6.6f, 9.9f, 12.3f, 15.6f,
			18.9f
		};
		const unsigned int n_tessellation_level_combinations = sizeof(tessellation_level_combinations) /
															   sizeof(tessellation_level_combinations[0]) /
															   6; /* 2 inner + 4 outer levels */

		for (unsigned int n_combination = 0; n_combination < n_tessellation_level_combinations; ++n_combination)
		{
			glw::GLfloat inner_tess_level[] = { tessellation_level_combinations[n_combination * 6 + 0],
												tessellation_level_combinations[n_combination * 6 + 1] };

			glw::GLfloat outer_tess_level[] = { tessellation_level_combinations[n_combination * 6 + 2],
												tessellation_level_combinations[n_combination * 6 + 3],
												tessellation_level_combinations[n_combination * 6 + 4],
												tessellation_level_combinations[n_combination * 6 + 5] };

			/* Test type determines how the tessellation levels should be set. */
			gl.useProgram(test_iterator->po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

			switch (test_iterator->type)
			{
			case TESSELLATION_TEST_TYPE_TCS_TES:
			{
				gl.uniform2fv(test_iterator->inner_tess_levels_uniform_location, 1, /* count */
							  inner_tess_level);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2fv() call failed");

				gl.uniform4fv(test_iterator->outer_tess_levels_uniform_location, 1, /* count */
							  outer_tess_level);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed");

				break;
			}

			case TESSELLATION_TEST_TYPE_TES:
			{
				if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
				{
					gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, inner_tess_level);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() call failed for"
													   " GL_PATCH_DEFAULT_INNER_LEVEL pname");

					gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, outer_tess_level);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() call failed for"
													   " GL_PATCH_DEFAULT_OUTER_LEVEL pname");
				}
				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized test type");
			}
			} /* switch (test_iterator->type) */

			/* Set up storage properties for the buffer object, to which XFBed data will be
			 * written:
			 *
			 * op(Outer[0])   tells how many times amount of points should be multiplied.
			 * op(Outer[1])+1 tells how many points we will receive.
			 *
			 * where op() defines an operator, behavior of which is determined by the vertex
			 * ordering mode specified in tessellation evaluation shader.
			 *
			 * Hence, we should be expecting Outer[0] * (Outer[1] + 1) points.
			 **/
			float outer_level0_clamped = 0.0f;
			float outer_level1_clamped = 0.0f;

			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
				TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, outer_tess_level[0], m_gl_max_tess_gen_level_value,
				DE_NULL, /* out_clamped */
				&outer_level0_clamped);
			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
				test_iterator->vertex_spacing, outer_tess_level[1], m_gl_max_tess_gen_level_value,
				DE_NULL, /* out_clamped */
				&outer_level1_clamped);

			const unsigned int n_bytes_needed = static_cast<unsigned int>(
				(unsigned int)(outer_level0_clamped) * (unsigned int)(outer_level1_clamped + 1) *
				(2 /* vec2 */ + 4 /* vec4 */) * sizeof(float));

			gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL /* data */, GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

			/* Render the test geometry */
			gl.beginTransformFeedback(GL_POINTS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");
			{
				/* A single vertex will do, since we configured GL_PATCH_VERTICES_EXT to be 1 */
				gl.drawArrays(GL_PATCHES_EXT, 0 /* first */, 1 /* count */);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
			}
			gl.endTransformFeedback();
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

			/* Now that the BO is filled with data, map it so we can check the storage's contents */
			const float* mapped_data_ptr = (const float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																		   n_bytes_needed, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the contents. For each result vertex, inner/outer tessellation levels should
			 * be unchanged. */
			const float		   epsilon = (float)1e-5;
			const unsigned int n_result_points =
				static_cast<unsigned int>(n_bytes_needed / sizeof(float) / (2 /* vec2 */ + 4 /* vec4 */));

			for (unsigned int n_point = 0; n_point < n_result_points; ++n_point)
			{
				const float* point_data_ptr = mapped_data_ptr + (2 /* vec2 */ + 4 /* vec4 */) * n_point;

				if (de::abs(point_data_ptr[2] - outer_tess_level[0]) > epsilon ||
					de::abs(point_data_ptr[3] - outer_tess_level[1]) > epsilon)
				{
					std::string vertex_spacing_mode_string =
						TessellationShaderUtils::getESTokenForVertexSpacingMode(test_iterator->vertex_spacing);

					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid inner/outer tessellation level used in TE stage;"
									   << " expected outer:(" << outer_tess_level[0] << ", " << outer_tess_level[1]
									   << ") "
									   << " rendered outer:(" << point_data_ptr[2] << ", " << point_data_ptr[3] << ")"
									   << " vertex spacing mode: " << vertex_spacing_mode_string.c_str()
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Invalid inner/outer tessellation level used in TE stage");
				}
			} /* for (all points) */

			/* All done - unmap the storage */
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (all tess level combinations) */
	}	 /* for (all tests) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}